

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O2

string * __thiscall
license::EventRegistry::to_string_abi_cxx11_(string *__return_storage_ptr__,EventRegistry *this)

{
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::_M_insert<void_const*>(local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

string EventRegistry::to_string() const {
	std::stringstream ss;
	ss << this;
	return ss.str();
}